

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::anon_unknown_1::ShaderOptimizationCase::init
          (ShaderOptimizationCase *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  TestLog *pTVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  ShaderProgram *this_00;
  long *plVar8;
  int *piVar9;
  TestError *this_01;
  string *psVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ProgramSources *sources;
  long lVar14;
  ulong uVar15;
  ScopedLogSection section;
  string local_168;
  ulong local_148;
  ScopedLogSection local_140;
  TestLog *local_138;
  string *local_130;
  RenderContext *local_128;
  ulong local_120;
  string local_118 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_88;
  deUint32 local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  bool local_50;
  vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> local_48;
  
  local_128 = ((this->super_TestCase).m_context)->m_renderCtx;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deqp::gls::ShaderPerformanceMeasurer::logParameters(&this->m_measurer,pTVar2);
  local_130 = &(this->super_TestCase).super_TestCase.super_TestNode.m_name;
  bVar7 = true;
  uVar11 = 0;
  local_138 = pTVar2;
  while( true ) {
    local_120 = uVar11;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (local_118,this,uVar11 & 0xff);
    psVar10 = local_130;
    lVar14 = 0x150;
    if ((uVar11 & 1) != 0) {
      lVar14 = 0x238;
    }
    sources = (ProgramSources *)
              ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + lVar14);
    lVar12 = 0;
    local_148 = uVar11 & 0xff;
    do {
      local_168.field_2._M_allocated_capacity =
           *(size_type *)((long)&(psVar10->_M_dataplus)._M_p + lVar12 + lVar14);
      uVar4 = *(undefined8 *)((long)&local_118[0]._M_dataplus._M_p + lVar12);
      uVar5 = *(undefined8 *)((long)&local_118[0]._M_string_length + lVar12);
      *(undefined8 *)((long)&(psVar10->_M_dataplus)._M_p + lVar12 + lVar14) =
           *(undefined8 *)((long)&local_118[0].field_2 + lVar12);
      puVar1 = (undefined8 *)((long)psVar10 + lVar12 + lVar14 + -0x10);
      local_168._M_dataplus._M_p = (pointer)*puVar1;
      local_168._M_string_length = puVar1[1];
      puVar1 = (undefined8 *)((long)psVar10 + lVar12 + lVar14 + -0x10);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      *(undefined8 *)((long)&local_118[0]._M_dataplus._M_p + lVar12) = 0;
      *(undefined8 *)((long)&local_118[0]._M_string_length + lVar12) = 0;
      *(undefined8 *)((long)&local_118[0].field_2 + lVar12) = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_168);
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x90);
    local_168.field_2._M_allocated_capacity =
         (size_type)
         (sources->attribLocationBindings).
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._M_dataplus._M_p =
         (pointer)(sources->attribLocationBindings).
                  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         (sources->attribLocationBindings).
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
               &local_168);
    sources->transformFeedbackBufferMode = local_70;
    local_168.field_2._M_allocated_capacity =
         (size_type)
         (sources->transformFeedbackVaryings).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_168._M_dataplus._M_p =
         (pointer)(sources->transformFeedbackVaryings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         (sources->transformFeedbackVaryings).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    sources->separable = local_50;
    local_168.field_2._M_allocated_capacity =
         (size_type)
         sources[1].sources[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->name;
    local_168._M_dataplus._M_p =
         (pointer)sources[1].sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         sources[1].sources[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_start)->name;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_finish)->name;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector
              ((vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> *)&local_168);
    std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_88);
    lVar14 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_118[0]._M_dataplus._M_p + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
    this_00 = (ShaderProgram *)operator_new(0xd0);
    glu::ShaderProgram::ShaderProgram(this_00,local_128,sources);
    plVar8 = (long *)operator_new(0x20);
    uVar11 = local_120;
    *(undefined4 *)(plVar8 + 1) = 0;
    *(undefined4 *)((long)plVar8 + 0xc) = 0;
    *plVar8 = (long)&PTR__SharedPtrState_0212cb98;
    plVar8[2] = (long)this_00;
    *(undefined4 *)(plVar8 + 1) = 1;
    *(undefined4 *)((long)plVar8 + 0xc) = 1;
    uVar15 = (ulong)(((uint)local_148 & 1) << 4);
    plVar3 = *(long **)((long)&(this->m_unoptimizedProgram).m_state + uVar15);
    uVar15 = uVar15 | 800;
    if (plVar3 != plVar8) {
      if (plVar3 != (long *)0x0) {
        LOCK();
        plVar3 = plVar3 + 1;
        *(int *)plVar3 = (int)*plVar3 + -1;
        UNLOCK();
        if ((int)*plVar3 == 0) {
          *(undefined8 *)
           ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + uVar15) = 0
          ;
          (**(code **)(**(long **)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                          m_testCtx + uVar15) + 0x10))();
        }
        LOCK();
        piVar9 = (int *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                          m_testCtx + uVar15) + 0xc);
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          plVar3 = *(long **)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx
                             + uVar15);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
          *(undefined8 *)
           ((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + uVar15) = 0;
        }
      }
      *(ShaderProgram **)
       ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + uVar15) =
           this_00;
      *(long **)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + uVar15) =
           plVar8;
      LOCK();
      *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
      UNLOCK();
      LOCK();
      piVar9 = (int *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                        m_testCtx + uVar15) + 0xc);
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    plVar3 = plVar8 + 1;
    LOCK();
    *(int *)plVar3 = (int)*plVar3 + -1;
    UNLOCK();
    if ((int)*plVar3 == 0) {
      (**(code **)(*plVar8 + 0x10))(plVar8);
    }
    pTVar2 = local_138;
    piVar9 = (int *)((long)plVar8 + 0xc);
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      (**(code **)(*plVar8 + 8))(plVar8);
    }
    iVar13 = 0x1bddede;
    if ((uVar11 & 1) != 0) {
      iVar13 = 0x1bddecd;
    }
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,iVar13,iVar13 + ((byte)~(byte)uVar11 & 1) * 2 + 0x10);
    iVar13 = 0x1bddf08;
    if ((uVar11 & 1) != 0) {
      iVar13 = 0x1bddef1;
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,iVar13,iVar13 + ((uint)local_148 & 1) * 3 + 0x13);
    psVar10 = &local_168;
    tcu::ScopedLogSection::ScopedLogSection(&local_140,pTVar2,local_118,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      (ulong)(local_168.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
    }
    glu::operator<<(pTVar2,*(ShaderProgram **)
                            ((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                    _vptr_TestNode + uVar15));
    tcu::TestLog::endSection(local_140.m_log);
    if (*(char *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                   _vptr_TestNode + uVar15) + 0xc0) == '\0') break;
    uVar11 = CONCAT71((int7)((ulong)psVar10 >> 8),1);
    bVar6 = !bVar7;
    bVar7 = false;
    if (bVar6) {
      this->m_state = STATE_INIT_UNOPTIMIZED;
      return (int)this;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOptimizationTests.cpp"
             ,0xf2);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderOptimizationCase::init (void)
{
	const glu::RenderContext&	renderCtx	= m_context.getRenderContext();
	TestLog&					log			= m_testCtx.getLog();

	m_measurer.logParameters(log);

	for (int ndx = 0; ndx < 2; ndx++)
	{
		const bool optimized = ndx == 1;

		programData(optimized) = generateProgramData(optimized);

		for (int i = 0; i < (int)programData(optimized).attributes.size(); i++)
			DE_ASSERT(programData(optimized).attributes[i].name != "a_position"); // \note Position attribute is set by m_measurer.

		program(optimized) = SharedPtr<const ShaderProgram>(new ShaderProgram(renderCtx, programData(optimized).sources));

		{
			const tcu::ScopedLogSection section(log, optimized ? "OptimizedProgram"			: "UnoptimizedProgram",
													 optimized ? "Hand-optimized program"	: "Unoptimized program");
			log << *program(optimized);
		}

		if (!program(optimized)->isOk())
			TCU_FAIL("Shader compilation failed");
	}

	m_state = STATE_INIT_UNOPTIMIZED;
}